

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_stats_table_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  longlong lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  longlong lVar14;
  ulong uVar15;
  ulong uVar16;
  longlong lVar17;
  longlong lVar18;
  longlong lVar19;
  longlong lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  ushort uVar76;
  short sVar77;
  short sVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int16_t *ptr_06;
  uint uVar82;
  int iVar83;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  ushort uVar84;
  long lVar85;
  long lVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  ushort uVar97;
  short sVar98;
  ushort uVar99;
  short sVar100;
  short sVar102;
  ushort uVar103;
  ushort uVar104;
  short sVar105;
  ushort uVar108;
  ushort uVar109;
  short sVar110;
  ushort uVar111;
  ushort uVar112;
  short sVar113;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  ushort uVar101;
  ushort uVar114;
  ulong uVar106;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  ulong uVar107;
  ushort uVar115;
  short sVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  __m128i alVar119;
  __m128i alVar120;
  __m128i alVar121;
  __m128i alVar122;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  int32_t in_stack_ffffffffffffe918;
  int local_16cc;
  int local_16c0;
  ulong uStack_16a8;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int16_t *l;
  int16_t *s;
  int16_t *m;
  int16_t *t;
  __m128i cond_max;
  __m128i vFtL;
  __m128i vFtS;
  __m128i vFtM;
  __m128i vFt;
  __m128i vGapperL_1;
  __m128i vGapper_1;
  __m128i case2;
  __m128i case1;
  __m128i vWS;
  __m128i *pvWS;
  __m128i vWM;
  __m128i *pvWM;
  __m128i vW;
  __m128i *pvW;
  __m128i vHpL;
  __m128i vHpS;
  __m128i vHpM;
  __m128i vHp;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_opn;
  __m128i vF_ext;
  __m128i vF;
  __m128i vHtL;
  __m128i vHtS;
  __m128i vHtM;
  __m128i vHt;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_opn;
  __m128i vE_ext;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_16_t h;
  int local_13a0;
  int local_139c;
  int32_t segNum;
  int32_t index;
  __m128i vGapperL;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLen;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vPosMask;
  __m128i vMaxL;
  __m128i vMaxS;
  __m128i vMaxM;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_12a0;
  int16_t local_129e;
  int16_t local_129c;
  ushort local_129a;
  int16_t length;
  int16_t similar;
  int16_t matches;
  int16_t score;
  __m128i vOne;
  __m128i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int16_t *boundary;
  __m128i *pvGapperL;
  __m128i *pvGapper;
  __m128i *pvHLMax;
  __m128i *pvHSMax;
  __m128i *pvHMMax;
  __m128i *pvHMax;
  __m128i *pvHL;
  __m128i *pvHS;
  __m128i *pvHM;
  __m128i *pvH;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvPs;
  __m128i *pvPm;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_998;
  short sStack_996;
  short sStack_994;
  short sStack_992;
  short sStack_990;
  short sStack_98e;
  short sStack_98c;
  short sStack_98a;
  short local_988;
  short sStack_986;
  short sStack_984;
  short sStack_982;
  short sStack_980;
  short sStack_97e;
  short sStack_97c;
  short sStack_97a;
  short local_978;
  short sStack_976;
  short sStack_974;
  short sStack_972;
  short sStack_970;
  short sStack_96e;
  short sStack_96c;
  short sStack_96a;
  short sStack_946;
  short sStack_944;
  short sStack_942;
  short sStack_940;
  short sStack_93e;
  short sStack_93c;
  short sStack_93a;
  short local_938;
  short sStack_936;
  short sStack_934;
  short sStack_932;
  short sStack_930;
  short sStack_92e;
  short sStack_92c;
  short sStack_92a;
  short local_928;
  short sStack_926;
  short sStack_924;
  short sStack_922;
  short sStack_920;
  short sStack_91e;
  short sStack_91c;
  short sStack_91a;
  short local_918;
  short sStack_916;
  short sStack_914;
  short sStack_912;
  short sStack_910;
  short sStack_90e;
  short sStack_90c;
  short sStack_90a;
  short local_8f8;
  short sStack_8f6;
  short sStack_8f4;
  short sStack_8f2;
  short sStack_8f0;
  short sStack_8ee;
  short sStack_8ec;
  short sStack_8ea;
  short local_8e8;
  short sStack_8e6;
  short sStack_8e4;
  short sStack_8e2;
  short sStack_8e0;
  short sStack_8de;
  short sStack_8dc;
  short sStack_8da;
  short local_8c8;
  short sStack_8c6;
  short sStack_8c4;
  short sStack_8c2;
  short sStack_8c0;
  short sStack_8be;
  short sStack_8bc;
  short sStack_8ba;
  short sStack_8b2;
  short sStack_8ae;
  short sStack_8ac;
  short sStack_8aa;
  short local_8a8;
  short sStack_8a6;
  short sStack_8a4;
  short sStack_8a2;
  short sStack_8a0;
  short sStack_89e;
  short sStack_89c;
  short sStack_89a;
  short local_898;
  short sStack_896;
  short sStack_894;
  short sStack_892;
  short sStack_890;
  short sStack_88e;
  short sStack_88c;
  short sStack_88a;
  short local_868;
  short sStack_866;
  short sStack_864;
  short sStack_862;
  short sStack_860;
  short sStack_85e;
  short sStack_85c;
  short sStack_85a;
  short local_848;
  short sStack_846;
  short sStack_844;
  short sStack_842;
  short sStack_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  short local_828;
  short sStack_826;
  short sStack_824;
  short sStack_822;
  short sStack_820;
  short sStack_81e;
  short sStack_81c;
  short sStack_81a;
  short local_7f8;
  short sStack_7f6;
  short sStack_7f4;
  short sStack_7f2;
  short sStack_7f0;
  short sStack_7ee;
  short sStack_7ec;
  short sStack_7ea;
  short local_7c8;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7c0;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  ushort local_7b8;
  ushort uStack_7b6;
  ushort uStack_7b4;
  ushort uStack_7b2;
  ushort uStack_7b0;
  ushort uStack_7ae;
  ushort uStack_7ac;
  ushort uStack_7aa;
  short local_7a8;
  short sStack_7a6;
  short sStack_7a4;
  short sStack_7a2;
  short sStack_7a0;
  short sStack_79e;
  short sStack_79c;
  short sStack_79a;
  short local_798;
  short sStack_796;
  short sStack_794;
  short sStack_792;
  short sStack_790;
  short sStack_78e;
  short sStack_78c;
  short sStack_78a;
  short local_6f8;
  short sStack_6f6;
  short sStack_6f4;
  short sStack_6f0;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_scan_profile_sse41_128_16",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_scan_profile_sse41_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_scan_profile_sse41_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_table_scan_profile_sse41_128_16"
            ,"profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_scan_profile_sse41_128_16",
            "s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_stats_table_scan_profile_sse41_128_16"
            ,"s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n",
            "parasail_sg_flags_stats_table_scan_profile_sse41_128_16","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n",
            "parasail_sg_flags_stats_table_scan_profile_sse41_128_16","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len + -1;
    ppVar5 = profile->matrix;
    iVar79 = (iVar1 + 7) / 8;
    iVar83 = (iVar1 + -1) % iVar79;
    iVar80 = ~((iVar1 + -1) / iVar79) + 8;
    pvVar6 = (profile->profile16).score;
    pvVar7 = (profile->profile16).matches;
    pvVar8 = (profile->profile16).similar;
    s1_beg_local._0_2_ = (short)open;
    uVar9 = CONCAT26((short)s1_beg_local,
                     CONCAT24((short)s1_beg_local,CONCAT22((short)s1_beg_local,(short)s1_beg_local))
                    );
    uVar12 = CONCAT26((short)s1_beg_local,
                      CONCAT24((short)s1_beg_local,CONCAT22((short)s1_beg_local,(short)s1_beg_local)
                              ));
    i._0_2_ = (short)gap;
    uVar10 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar13 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    if (ppVar5->min <= -open) {
      s1_beg_local._0_2_ = -(short)ppVar5->min;
    }
    uVar76 = (short)s1_beg_local + 0x8001;
    sVar77 = ((ushort)ppVar5->max ^ 0x7fff) - 1;
    local_129c = 0;
    local_129e = 0;
    local_12a0 = 0;
    lVar11 = CONCAT26(uVar76,CONCAT24(uVar76,CONCAT22(uVar76,uVar76)));
    lVar14 = CONCAT26(uVar76,CONCAT24(uVar76,CONCAT22(uVar76,uVar76)));
    vSaturationCheckMax[1] = CONCAT26(sVar77,CONCAT24(sVar77,CONCAT22(sVar77,sVar77)));
    vSaturationCheckMin[0] = CONCAT26(sVar77,CONCAT24(sVar77,CONCAT22(sVar77,sVar77)));
    vMaxM[0] = lVar14;
    vMaxS[1] = lVar11;
    vMaxS[0] = lVar14;
    vMaxL[1] = lVar11;
    vMaxL[0] = lVar14;
    vPosMask[1] = lVar11;
    pvP._0_2_ = (short)iVar80;
    position._0_2_ = (short)iVar79;
    auVar75._2_2_ = (short)position;
    auVar75._0_2_ = (short)position;
    auVar75._4_2_ = (short)position;
    auVar75._10_2_ = (short)position;
    auVar75._8_2_ = (short)position;
    auVar75._12_2_ = (short)position;
    auVar75._6_2_ = (short)position;
    vSegLenXgap[1] = CONCAT62(0,uVar76);
    sVar78 = -(short)position * (short)i;
    auVar92._2_2_ = sVar78;
    auVar92._0_2_ = sVar78;
    auVar92._4_2_ = sVar78;
    auVar92._10_2_ = sVar78;
    auVar92._8_2_ = sVar78;
    auVar92._12_2_ = sVar78;
    auVar92._6_2_ = sVar78;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = vSegLenXgap[1];
    auVar92._14_2_ = 0;
    auVar91 = paddsw(auVar91,auVar92 << 0x10);
    iVar81 = s1_beg;
    profile_local = (parasail_profile_t *)parasail_result_new_table3(iVar79 * 8,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x8210402;
      uVar82 = 0;
      if (s1_beg != 0) {
        uVar82 = 8;
      }
      *(uint *)&profile_local->field_0xc = uVar82 | *(uint *)&profile_local->field_0xc;
      uVar82 = 0;
      if (s1_end != 0) {
        uVar82 = 0x10;
      }
      *(uint *)&profile_local->field_0xc = uVar82 | *(uint *)&profile_local->field_0xc;
      uVar82 = 0;
      if (s2_beg != 0) {
        uVar82 = 0x4000;
      }
      *(uint *)&profile_local->field_0xc = uVar82 | *(uint *)&profile_local->field_0xc;
      uVar82 = 0;
      if (s2_end != 0) {
        uVar82 = 0x8000;
      }
      *(uint *)&profile_local->field_0xc = uVar82 | *(uint *)&profile_local->field_0xc;
      uVar82 = *(uint *)&profile_local->field_0xc | 0x20000;
      len = (size_t)uVar82;
      *(uint *)&profile_local->field_0xc = uVar82;
      b = parasail_memalign___m128i(0x10,(long)iVar79);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar79);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar79);
      b_02 = parasail_memalign___m128i(0x10,(long)iVar79);
      ptr = parasail_memalign___m128i(0x10,(long)iVar79);
      b_03 = parasail_memalign___m128i(0x10,(long)iVar79);
      b_04 = parasail_memalign___m128i(0x10,(long)iVar79);
      b_05 = parasail_memalign___m128i(0x10,(long)iVar79);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar79);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar79);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar79);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar79);
      ptr_04 = parasail_memalign___m128i(0x10,(long)iVar79);
      ptr_05 = parasail_memalign___m128i(0x10,(long)iVar79);
      ptr_06 = parasail_memalign_int16_t(0x10,(long)(s2Len + 1));
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_06 == (int16_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar119[0] = (long)iVar79;
        alVar119[1] = extraout_RDX;
        parasail_memset___m128i(b_03,alVar119,len);
        alVar120[0] = (long)iVar79;
        alVar120[1] = extraout_RDX_00;
        parasail_memset___m128i(b_04,alVar120,len);
        alVar121[0] = (long)iVar79;
        alVar121[1] = extraout_RDX_01;
        parasail_memset___m128i(b_05,alVar121,len);
        alVar122[0] = (long)iVar79;
        alVar122[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar122,len);
        c[0] = (long)iVar79;
        c[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,c,len);
        c_00[0] = (long)iVar79;
        c_00[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,c_00,len);
        c_01[0] = (long)iVar79;
        c_01[1] = extraout_RDX_05;
        parasail_memset___m128i(b_02,c_01,len);
        auVar93._8_8_ = uVar12;
        auVar93._0_8_ = uVar9;
        register0x00001200 = psubsw(ZEXT816(0),auVar93);
        vGapperL[0] = 0x1000100010001;
        _segNum = 0x1000100010001;
        k = iVar79;
        while (k = k + -1, -1 < k) {
          ptr_04[k][0] = vGapperL[1];
          ptr_04[k][1] = vGapper[0];
          ptr_05[k][0] = _segNum;
          ptr_05[k][1] = vGapperL[0];
          auVar95._8_8_ = uVar13;
          auVar95._0_8_ = uVar10;
          register0x00001200 = psubsw(stack0xffffffffffffec78,auVar95);
          auVar94._8_8_ = 0x1000100010001;
          auVar94._0_8_ = 0x1000100010001;
          _segNum = paddsw(_segNum,auVar94);
        }
        local_139c = 0;
        for (k = 0; k < iVar79; k = k + 1) {
          for (local_13a0 = 0; local_13a0 < 8; local_13a0 = local_13a0 + 1) {
            if (s1_beg == 0) {
              local_16c0 = -(gap * (local_13a0 * iVar79 + k)) - open;
            }
            else {
              local_16c0 = 0;
            }
            if (local_16c0 < -0x8000) {
              local_16c0 = -0x8000;
            }
            *(short *)((long)&tmp + (long)local_13a0 * 2) = (short)local_16c0;
          }
          ptr[local_139c][0] = tmp;
          ptr[local_139c][1] = h.m[0];
          local_139c = local_139c + 1;
        }
        *ptr_06 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_16cc = -(gap * (k + -1)) - open;
          }
          else {
            local_16cc = 0;
          }
          if (local_16cc < -0x8000) {
            local_16cc = -0x8000;
          }
          ptr_06[k] = (int16_t)local_16cc;
        }
        vMaxM[1] = lVar11;
        vMaxH[0] = lVar14;
        vMaxH[1] = lVar11;
        vSaturationCheckMax[0] = lVar14;
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          uVar107 = ptr[iVar79 + -1][0];
          uVar106 = b_03[iVar79 + -1][0];
          uVar15 = b_04[iVar79 + -1][0];
          uVar16 = b_05[iVar79 + -1][0];
          vHpM[0] = b_03[iVar79 + -1][1] << 0x10 | uVar106 >> 0x30;
          vHpS[1] = uVar106 << 0x10;
          vHpS[0] = b_04[iVar79 + -1][1] << 0x10 | uVar15 >> 0x30;
          vHpL[1] = uVar15 << 0x10;
          vHpL[0] = b_05[iVar79 + -1][1] << 0x10 | uVar16 >> 0x30;
          pvW = (__m128i *)(uVar16 << 0x10);
          vHp[0] = ptr[iVar79 + -1][1] << 0x10 | uVar107 >> 0x30;
          vHpM[1] = uVar107 << 0x10 | (ulong)(ushort)ptr_06[s1Len];
          iVar2 = ppVar5->mapper[(byte)s2[s1Len]];
          iVar3 = ppVar5->mapper[(byte)s2[s1Len]];
          iVar4 = ppVar5->mapper[(byte)s2[s1Len]];
          auVar96._8_8_ = lVar14;
          auVar96._0_8_ = lVar11;
          register0x00001200 = psubsw(auVar96,(undefined1  [16])*ptr_04);
          vF[0] = lVar14;
          vF_ext[1] = lVar11;
          stack0xffffffffffffeb58 = ZEXT816(0);
          stack0xffffffffffffeb48 = ZEXT816(0);
          stack0xffffffffffffeb38 = ZEXT816(0);
          k = 0;
          while( true ) {
            auVar92 = stack0xffffffffffffebc8;
            local_6f8 = (short)vF_ext[1];
            sStack_6f6 = vF_ext[1]._2_2_;
            sStack_6f4 = vF_ext[1]._4_2_;
            sStack_8b2 = vF_ext[1]._6_2_;
            sStack_6f0 = (short)vF_ext[2];
            sStack_8ae = vF_ext[2]._2_2_;
            sStack_8ac = vF_ext[2]._4_2_;
            sStack_8aa = vF_ext[2]._6_2_;
            if (iVar79 <= k) break;
            alVar119 = ptr[k];
            alVar120 = b_03[k];
            alVar121 = b_04[k];
            alVar122 = b_05[k];
            auVar32._8_8_ = uVar12;
            auVar32._0_8_ = uVar9;
            auVar92 = psubsw((undefined1  [16])ptr[k],auVar32);
            auVar31._8_8_ = uVar13;
            auVar31._0_8_ = uVar10;
            auVar93 = psubsw((undefined1  [16])b[k],auVar31);
            local_898 = auVar92._0_2_;
            sStack_896 = auVar92._2_2_;
            sStack_894 = auVar92._4_2_;
            sStack_892 = auVar92._6_2_;
            sStack_890 = auVar92._8_2_;
            sStack_88e = auVar92._10_2_;
            sStack_88c = auVar92._12_2_;
            sStack_88a = auVar92._14_2_;
            local_8a8 = auVar93._0_2_;
            sStack_8a6 = auVar93._2_2_;
            sStack_8a4 = auVar93._4_2_;
            sStack_8a2 = auVar93._6_2_;
            sStack_8a0 = auVar93._8_2_;
            sStack_89e = auVar93._10_2_;
            sStack_89c = auVar93._12_2_;
            sStack_89a = auVar93._14_2_;
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_8a6 < sStack_896),-(ushort)(local_8a8 < local_898));
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_8a4 < sStack_894),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_8a2 < sStack_892),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_89e < sStack_88e),-(ushort)(sStack_8a0 < sStack_890));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_89c < sStack_88c),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_89a < sStack_88a),(undefined6)case1[0]);
            uVar84 = (ushort)(local_898 < local_8a8) * local_8a8 |
                     (ushort)(local_898 >= local_8a8) * local_898;
            uVar97 = (ushort)(sStack_896 < sStack_8a6) * sStack_8a6 |
                     (ushort)(sStack_896 >= sStack_8a6) * sStack_896;
            uVar99 = (ushort)(sStack_894 < sStack_8a4) * sStack_8a4 |
                     (ushort)(sStack_894 >= sStack_8a4) * sStack_894;
            uVar101 = (ushort)(sStack_892 < sStack_8a2) * sStack_8a2 |
                      (ushort)(sStack_892 >= sStack_8a2) * sStack_892;
            uVar103 = (ushort)(sStack_890 < sStack_8a0) * sStack_8a0 |
                      (ushort)(sStack_890 >= sStack_8a0) * sStack_890;
            uVar108 = (ushort)(sStack_88e < sStack_89e) * sStack_89e |
                      (ushort)(sStack_88e >= sStack_89e) * sStack_88e;
            uVar111 = (ushort)(sStack_88c < sStack_89c) * sStack_89c |
                      (ushort)(sStack_88c >= sStack_89c) * sStack_88c;
            uVar114 = (ushort)(sStack_88a < sStack_89a) * sStack_89a |
                      (ushort)(sStack_88a >= sStack_89a) * sStack_88a;
            vE_ext[1] = CONCAT26(uVar101,CONCAT24(uVar99,CONCAT22(uVar97,uVar84)));
            vE[0] = CONCAT26(uVar114,CONCAT24(uVar111,CONCAT22(uVar108,uVar103)));
            auVar72._8_8_ = case1[0];
            auVar72._0_8_ = case2[1];
            auVar117 = pblendvb((undefined1  [16])b_00[k],(undefined1  [16])b_03[k],auVar72);
            auVar71._8_8_ = case1[0];
            auVar71._0_8_ = case2[1];
            auVar118 = pblendvb((undefined1  [16])b_01[k],(undefined1  [16])b_04[k],auVar71);
            auVar70._8_8_ = case1[0];
            auVar70._0_8_ = case2[1];
            auVar92 = pblendvb((undefined1  [16])b_02[k],(undefined1  [16])b_05[k],auVar70);
            auVar27._8_8_ = 0x1000100010001;
            auVar27._0_8_ = 0x1000100010001;
            auVar92 = paddsw(auVar92,auVar27);
            auVar93 = paddsw(stack0xffffffffffffebc8,(undefined1  [16])ptr_04[k]);
            local_8c8 = auVar93._0_2_;
            sStack_8c6 = auVar93._2_2_;
            sStack_8c4 = auVar93._4_2_;
            sStack_8c2 = auVar93._6_2_;
            sStack_8c0 = auVar93._8_2_;
            sStack_8be = auVar93._10_2_;
            sStack_8bc = auVar93._12_2_;
            sStack_8ba = auVar93._14_2_;
            uVar107 = CONCAT26(-(ushort)(sStack_8c2 < sStack_8b2),
                               CONCAT24(-(ushort)(sStack_8c4 < sStack_6f4),
                                        CONCAT22(-(ushort)(sStack_8c6 < sStack_6f6),
                                                 -(ushort)(local_8c8 < local_6f8)))) |
                      CONCAT26(-(ushort)(sStack_8b2 == sStack_8c2),
                               CONCAT24(-(ushort)(sStack_6f4 == sStack_8c4),
                                        CONCAT22(-(ushort)(sStack_6f6 == sStack_8c6),
                                                 -(ushort)(local_6f8 == local_8c8))));
            uVar106 = CONCAT26(-(ushort)(sStack_8ba < sStack_8aa),
                               CONCAT24(-(ushort)(sStack_8bc < sStack_8ac),
                                        CONCAT22(-(ushort)(sStack_8be < sStack_8ae),
                                                 -(ushort)(sStack_8c0 < sStack_6f0)))) |
                      CONCAT26(-(ushort)(sStack_8aa == sStack_8ba),
                               CONCAT24(-(ushort)(sStack_8ac == sStack_8bc),
                                        CONCAT22(-(ushort)(sStack_8ae == sStack_8be),
                                                 -(ushort)(sStack_6f0 == sStack_8c0))));
            vF_ext[1]._0_4_ =
                 CONCAT22((ushort)(sStack_6f6 < sStack_8c6) * sStack_8c6 |
                          (ushort)(sStack_6f6 >= sStack_8c6) * sStack_6f6,
                          (ushort)(local_6f8 < local_8c8) * local_8c8 |
                          (ushort)(local_6f8 >= local_8c8) * local_6f8);
            vF_ext[1]._0_6_ =
                 CONCAT24((ushort)(sStack_6f4 < sStack_8c4) * sStack_8c4 |
                          (ushort)(sStack_6f4 >= sStack_8c4) * sStack_6f4,(undefined4)vF_ext[1]);
            vF_ext[1] = CONCAT26((ushort)(sStack_8b2 < sStack_8c2) * sStack_8c2 |
                                 (ushort)(sStack_8b2 >= sStack_8c2) * sStack_8b2,
                                 (undefined6)vF_ext[1]);
            vF[0]._0_2_ = (ushort)(sStack_6f0 < sStack_8c0) * sStack_8c0 |
                          (ushort)(sStack_6f0 >= sStack_8c0) * sStack_6f0;
            vF[0]._2_2_ = (ushort)(sStack_8ae < sStack_8be) * sStack_8be |
                          (ushort)(sStack_8ae >= sStack_8be) * sStack_8ae;
            vF[0]._4_2_ = (ushort)(sStack_8ac < sStack_8bc) * sStack_8bc |
                          (ushort)(sStack_8ac >= sStack_8bc) * sStack_8ac;
            vF[0]._6_2_ = (ushort)(sStack_8aa < sStack_8ba) * sStack_8ba |
                          (ushort)(sStack_8aa >= sStack_8ba) * sStack_8aa;
            auVar69._8_8_ = uVar106;
            auVar69._0_8_ = uVar107;
            register0x00001240 = pblendvb(stack0xffffffffffffebb8,stack0xffffffffffffeb58,auVar69);
            auVar68._8_8_ = uVar106;
            auVar68._0_8_ = uVar107;
            register0x00001240 = pblendvb(stack0xffffffffffffeba8,stack0xffffffffffffeb48,auVar68);
            auVar93 = paddsw(stack0xffffffffffffeb98,(undefined1  [16])ptr_05[k]);
            auVar67._8_8_ = uVar106;
            auVar67._0_8_ = uVar107;
            register0x00001240 = pblendvb(auVar93,stack0xffffffffffffeb38,auVar67);
            auVar93 = paddsw((undefined1  [16])stack0xffffffffffffeae8,
                             *(undefined1 (*) [16])
                              ((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar79) * 0x10));
            auVar94 = paddsw((undefined1  [16])stack0xffffffffffffead8,
                             *(undefined1 (*) [16])
                              ((long)pvVar7 + (long)k * 0x10 + (long)(iVar3 * iVar79) * 0x10));
            auVar95 = paddsw((undefined1  [16])stack0xffffffffffffeac8,
                             *(undefined1 (*) [16])
                              ((long)pvVar8 + (long)k * 0x10 + (long)(iVar4 * iVar79) * 0x10));
            auVar26._8_8_ = 0x1000100010001;
            auVar26._0_8_ = 0x1000100010001;
            auVar96 = paddsw((undefined1  [16])_pvW,auVar26);
            vHpM[1] = auVar93._0_8_;
            vHp[0] = auVar93._8_8_;
            local_8e8 = auVar93._0_2_;
            sStack_8e6 = auVar93._2_2_;
            sStack_8e4 = auVar93._4_2_;
            sStack_8e2 = auVar93._6_2_;
            sStack_8e0 = auVar93._8_2_;
            sStack_8de = auVar93._10_2_;
            sStack_8dc = auVar93._12_2_;
            sStack_8da = auVar93._14_2_;
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_8e6 < (short)uVar97),-(ushort)(local_8e8 < (short)uVar84)
                         );
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_8e4 < (short)uVar99),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_8e2 < (short)uVar101),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_8de < (short)uVar108),
                          -(ushort)(sStack_8e0 < (short)uVar103));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_8dc < (short)uVar111),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_8da < (short)uVar114),(undefined6)case1[0]);
            vHtM[1] = CONCAT26((ushort)((short)uVar101 < sStack_8e2) * sStack_8e2 |
                               ((short)uVar101 >= sStack_8e2) * uVar101,
                               CONCAT24((ushort)((short)uVar99 < sStack_8e4) * sStack_8e4 |
                                        ((short)uVar99 >= sStack_8e4) * uVar99,
                                        CONCAT22((ushort)((short)uVar97 < sStack_8e6) * sStack_8e6 |
                                                 ((short)uVar97 >= sStack_8e6) * uVar97,
                                                 (ushort)((short)uVar84 < local_8e8) * local_8e8 |
                                                 ((short)uVar84 >= local_8e8) * uVar84)));
            vHt[0]._0_2_ = (ushort)((short)uVar103 < sStack_8e0) * sStack_8e0 |
                           ((short)uVar103 >= sStack_8e0) * uVar103;
            vHt[0]._2_2_ = (ushort)((short)uVar108 < sStack_8de) * sStack_8de |
                           ((short)uVar108 >= sStack_8de) * uVar108;
            vHt[0]._4_2_ = (ushort)((short)uVar111 < sStack_8dc) * sStack_8dc |
                           ((short)uVar111 >= sStack_8dc) * uVar111;
            vHt[0]._6_2_ = (ushort)((short)uVar114 < sStack_8da) * sStack_8da |
                           ((short)uVar114 >= sStack_8da) * uVar114;
            vHpS[1] = auVar94._0_8_;
            vHpM[0] = auVar94._8_8_;
            vES[1] = auVar117._0_8_;
            vEM[0] = auVar117._8_8_;
            auVar66._8_8_ = case1[0];
            auVar66._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar94,auVar117,auVar66);
            vHpL[1] = auVar95._0_8_;
            vHpS[0] = auVar95._8_8_;
            vEL[1] = auVar118._0_8_;
            vES[0] = auVar118._8_8_;
            auVar65._8_8_ = case1[0];
            auVar65._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar95,auVar118,auVar65);
            pvW = auVar96._0_8_;
            vHpL[0] = auVar96._8_8_;
            vHt[1] = auVar92._0_8_;
            vEL[0] = auVar92._8_8_;
            auVar64._8_8_ = case1[0];
            auVar64._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar96,auVar92,auVar64);
            b[k][0] = vE_ext[1];
            b[k][1] = vE[0];
            b_00[k][0] = vES[1];
            b_00[k][1] = vEM[0];
            b_01[k][0] = vEL[1];
            b_01[k][1] = vES[0];
            b_02[k][0] = vHt[1];
            b_02[k][1] = vEL[0];
            ptr[k][0] = vHpM[1];
            ptr[k][1] = vHp[0];
            b_03[k][0] = vHpS[1];
            b_03[k][1] = vHpM[0];
            b_04[k][0] = vHpL[1];
            b_04[k][1] = vHpS[0];
            b_05[k][0] = (longlong)pvW;
            b_05[k][1] = vHpL[0];
            k = k + 1;
            _pvW = alVar122;
            unique0x10007016 = alVar121;
            unique0x10007036 = alVar120;
            unique0x10007056 = alVar119;
          }
          uVar107 = vHt[0] << 0x10 | (ulong)vHtM[1] >> 0x30;
          vHt[0] = uVar107;
          vHtM[1] = vHtM[1] << 0x10;
          lVar85 = vHtS[1] << 0x10;
          vHtM[0] = vHtM[0] << 0x10 | (ulong)vHtS[1] >> 0x30;
          vHtS[1] = lVar85;
          lVar86 = vHtL[1] << 0x10;
          vHtS[0] = vHtS[0] << 0x10 | (ulong)vHtL[1] >> 0x30;
          vHtL[1] = lVar86;
          lVar87 = vF[1] << 0x10;
          vHtL[0] = vHtL[0] << 0x10 | (ulong)vF[1] >> 0x30;
          vF[1] = lVar87;
          sVar78 = ptr_06[(long)s1Len + 1];
          vHtM[1]._0_2_ = sVar78;
          auVar118._8_8_ = uVar107;
          auVar118._0_8_ = vHtM[1];
          auVar93 = paddsw(auVar118,(undefined1  [16])*ptr_04);
          local_8f8 = auVar93._0_2_;
          sStack_8f6 = auVar93._2_2_;
          sStack_8f4 = auVar93._4_2_;
          sStack_8f2 = auVar93._6_2_;
          sStack_8f0 = auVar93._8_2_;
          sStack_8ee = auVar93._10_2_;
          sStack_8ec = auVar93._12_2_;
          sStack_8ea = auVar93._14_2_;
          uVar107 = CONCAT26(-(ushort)(sStack_8b2 < sStack_8f2),
                             CONCAT24(-(ushort)(sStack_6f4 < sStack_8f4),
                                      CONCAT22(-(ushort)(sStack_6f6 < sStack_8f6),
                                               -(ushort)(local_6f8 < local_8f8)))) |
                    CONCAT26(-(ushort)(sStack_8f2 == sStack_8b2),
                             CONCAT24(-(ushort)(sStack_8f4 == sStack_6f4),
                                      CONCAT22(-(ushort)(sStack_8f6 == sStack_6f6),
                                               -(ushort)(local_8f8 == local_6f8))));
          uVar106 = CONCAT26(-(ushort)(sStack_8aa < sStack_8ea),
                             CONCAT24(-(ushort)(sStack_8ac < sStack_8ec),
                                      CONCAT22(-(ushort)(sStack_8ae < sStack_8ee),
                                               -(ushort)(sStack_6f0 < sStack_8f0)))) |
                    CONCAT26(-(ushort)(sStack_8ea == sStack_8aa),
                             CONCAT24(-(ushort)(sStack_8ec == sStack_8ac),
                                      CONCAT22(-(ushort)(sStack_8ee == sStack_8ae),
                                               -(ushort)(sStack_8f0 == sStack_6f0))));
          vF_ext[1]._0_4_ =
               CONCAT22((ushort)(sStack_6f6 < sStack_8f6) * sStack_8f6 |
                        (ushort)(sStack_6f6 >= sStack_8f6) * sStack_6f6,
                        (ushort)(local_6f8 < local_8f8) * local_8f8 |
                        (ushort)(local_6f8 >= local_8f8) * local_6f8);
          vF_ext[1]._0_6_ =
               CONCAT24((ushort)(sStack_6f4 < sStack_8f4) * sStack_8f4 |
                        (ushort)(sStack_6f4 >= sStack_8f4) * sStack_6f4,(undefined4)vF_ext[1]);
          vF_ext[1] = CONCAT26((ushort)(sStack_8b2 < sStack_8f2) * sStack_8f2 |
                               (ushort)(sStack_8b2 >= sStack_8f2) * sStack_8b2,(undefined6)vF_ext[1]
                              );
          vF[0]._0_2_ = (ushort)(sStack_6f0 < sStack_8f0) * sStack_8f0 |
                        (ushort)(sStack_6f0 >= sStack_8f0) * sStack_6f0;
          vF[0]._2_2_ = (ushort)(sStack_8ae < sStack_8ee) * sStack_8ee |
                        (ushort)(sStack_8ae >= sStack_8ee) * sStack_8ae;
          vF[0]._4_2_ = (ushort)(sStack_8ac < sStack_8ec) * sStack_8ec |
                        (ushort)(sStack_8ac >= sStack_8ec) * sStack_8ac;
          vF[0]._6_2_ = (ushort)(sStack_8aa < sStack_8ea) * sStack_8ea |
                        (ushort)(sStack_8aa >= sStack_8ea) * sStack_8aa;
          auVar63._8_8_ = vHtM[0];
          auVar63._0_8_ = lVar85;
          auVar62._8_8_ = uVar106;
          auVar62._0_8_ = uVar107;
          register0x00001240 = pblendvb(stack0xffffffffffffeb58,auVar63,auVar62);
          auVar61._8_8_ = vHtS[0];
          auVar61._0_8_ = lVar86;
          auVar60._8_8_ = uVar106;
          auVar60._0_8_ = uVar107;
          register0x00001240 = pblendvb(stack0xffffffffffffeb48,auVar61,auVar60);
          auVar117._8_8_ = vHtL[0];
          auVar117._0_8_ = lVar87;
          auVar93 = paddsw(auVar117,(undefined1  [16])*ptr_05);
          auVar59._8_8_ = uVar106;
          auVar59._0_8_ = uVar107;
          register0x00001240 = pblendvb(stack0xffffffffffffeb38,auVar93,auVar59);
          k = 0;
          while( true ) {
            if (5 < k) break;
            auVar25._8_8_ = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
            auVar25._0_8_ = vF_ext[1] << 0x10;
            auVar93 = paddsw(auVar25,auVar91);
            local_918 = auVar93._0_2_;
            sStack_916 = auVar93._2_2_;
            sStack_914 = auVar93._4_2_;
            sStack_912 = auVar93._6_2_;
            sStack_910 = auVar93._8_2_;
            sStack_90e = auVar93._10_2_;
            sStack_90c = auVar93._12_2_;
            sStack_90a = auVar93._14_2_;
            local_928 = (short)vF_ext[1];
            sStack_926 = vF_ext[1]._2_2_;
            sStack_924 = vF_ext[1]._4_2_;
            sStack_922 = vF_ext[1]._6_2_;
            sStack_920 = (short)vF_ext[2];
            sStack_91e = vF_ext[2]._2_2_;
            sStack_91c = vF_ext[2]._4_2_;
            sStack_91a = vF_ext[2]._6_2_;
            uVar107 = CONCAT26(-(ushort)(sStack_922 < sStack_912),
                               CONCAT24(-(ushort)(sStack_924 < sStack_914),
                                        CONCAT22(-(ushort)(sStack_926 < sStack_916),
                                                 -(ushort)(local_928 < local_918)))) |
                      CONCAT26(-(ushort)(sStack_912 == sStack_922),
                               CONCAT24(-(ushort)(sStack_914 == sStack_924),
                                        CONCAT22(-(ushort)(sStack_916 == sStack_926),
                                                 -(ushort)(local_918 == local_928))));
            uVar106 = CONCAT26(-(ushort)(sStack_91a < sStack_90a),
                               CONCAT24(-(ushort)(sStack_91c < sStack_90c),
                                        CONCAT22(-(ushort)(sStack_91e < sStack_90e),
                                                 -(ushort)(sStack_920 < sStack_910)))) |
                      CONCAT26(-(ushort)(sStack_90a == sStack_91a),
                               CONCAT24(-(ushort)(sStack_90c == sStack_91c),
                                        CONCAT22(-(ushort)(sStack_90e == sStack_91e),
                                                 -(ushort)(sStack_910 == sStack_920))));
            vF_ext[1]._0_4_ =
                 CONCAT22((ushort)(sStack_926 < sStack_916) * sStack_916 |
                          (ushort)(sStack_926 >= sStack_916) * sStack_926,
                          (ushort)(local_928 < local_918) * local_918 |
                          (ushort)(local_928 >= local_918) * local_928);
            vF_ext[1]._0_6_ =
                 CONCAT24((ushort)(sStack_924 < sStack_914) * sStack_914 |
                          (ushort)(sStack_924 >= sStack_914) * sStack_924,(undefined4)vF_ext[1]);
            vF_ext[1] = CONCAT26((ushort)(sStack_922 < sStack_912) * sStack_912 |
                                 (ushort)(sStack_922 >= sStack_912) * sStack_922,
                                 (undefined6)vF_ext[1]);
            vF[0]._0_2_ = (ushort)(sStack_920 < sStack_910) * sStack_910 |
                          (ushort)(sStack_920 >= sStack_910) * sStack_920;
            vF[0]._2_2_ = (ushort)(sStack_91e < sStack_90e) * sStack_90e |
                          (ushort)(sStack_91e >= sStack_90e) * sStack_91e;
            vF[0]._4_2_ = (ushort)(sStack_91c < sStack_90c) * sStack_90c |
                          (ushort)(sStack_91c >= sStack_90c) * sStack_91c;
            vF[0]._6_2_ = (ushort)(sStack_91a < sStack_90a) * sStack_90a |
                          (ushort)(sStack_91a >= sStack_90a) * sStack_91a;
            auVar58._8_8_ = vFM[0] << 0x10 | (ulong)vFS[1] >> 0x30;
            auVar58._0_8_ = vFS[1] << 0x10;
            auVar57._8_8_ = uVar106;
            auVar57._0_8_ = uVar107;
            register0x00001240 = pblendvb(stack0xffffffffffffeb58,auVar58,auVar57);
            auVar56._8_8_ = vFS[0] << 0x10 | (ulong)vFL[1] >> 0x30;
            auVar56._0_8_ = vFL[1] << 0x10;
            auVar55._8_8_ = uVar106;
            auVar55._0_8_ = uVar107;
            register0x00001240 = pblendvb(stack0xffffffffffffeb48,auVar56,auVar55);
            auVar24._8_8_ = vFL[0] << 0x10 | (ulong)vH[1] >> 0x30;
            auVar24._0_8_ = vH[1] << 0x10;
            auVar75._14_2_ = 0;
            auVar93 = paddsw(auVar24,auVar75 << 0x10);
            auVar54._8_8_ = uVar106;
            auVar54._0_8_ = uVar107;
            register0x00001240 = pblendvb(stack0xffffffffffffeb38,auVar93,auVar54);
            k = k + 1;
          }
          lVar88 = vFS[1] << 0x10;
          vFM[0] = vFM[0] << 0x10 | (ulong)vFS[1] >> 0x30;
          vFS[1] = lVar88;
          lVar89 = vFL[1] << 0x10;
          vFS[0] = vFS[0] << 0x10 | (ulong)vFL[1] >> 0x30;
          vFL[1] = lVar89;
          lVar90 = vH[1] << 0x10;
          vFL[0] = vFL[0] << 0x10 | (ulong)vH[1] >> 0x30;
          vH[1] = lVar90;
          auVar23._8_8_ = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
          auVar23._0_8_ = vF_ext[1] << 0x10;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = vSegLenXgap[1];
          register0x00001200 = paddsw(auVar23,auVar22);
          local_938 = (short)vF_ext[1];
          sStack_936 = vF_ext[1]._2_2_;
          sStack_934 = vF_ext[1]._4_2_;
          sStack_932 = vF_ext[1]._6_2_;
          sStack_930 = (short)vF_ext[2];
          sStack_92e = vF_ext[2]._2_2_;
          sStack_92c = vF_ext[2]._4_2_;
          sStack_92a = vF_ext[2]._6_2_;
          sStack_946 = auVar92._0_2_;
          sStack_944 = auVar92._2_2_;
          sStack_942 = auVar92._4_2_;
          sStack_940 = auVar92._6_2_;
          sStack_93e = auVar92._8_2_;
          sStack_93c = auVar92._10_2_;
          sStack_93a = auVar92._12_2_;
          case2[1]._0_4_ =
               CONCAT22(-(ushort)(sStack_946 < sStack_936),-(ushort)(sVar78 < local_938));
          case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_944 < sStack_934),(undefined4)case2[1]);
          case2[1] = CONCAT26(-(ushort)(sStack_942 < sStack_932),(undefined6)case2[1]);
          case1[0]._0_4_ =
               CONCAT22(-(ushort)(sStack_93e < sStack_92e),-(ushort)(sStack_940 < sStack_930));
          case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_93c < sStack_92c),(undefined4)case1[0]);
          case1[0] = CONCAT26(-(ushort)(sStack_93a < sStack_92a),(undefined6)case1[0]);
          vHM[1]._0_4_ = CONCAT22((ushort)(sStack_936 < sStack_946) * sStack_946 |
                                  (ushort)(sStack_936 >= sStack_946) * sStack_936,
                                  (ushort)(local_938 < sVar78) * sVar78 |
                                  (ushort)(local_938 >= sVar78) * local_938);
          vHM[1]._0_6_ = CONCAT24((ushort)(sStack_934 < sStack_944) * sStack_944 |
                                  (ushort)(sStack_934 >= sStack_944) * sStack_934,(undefined4)vHM[1]
                                 );
          vHM[1] = CONCAT26((ushort)(sStack_932 < sStack_942) * sStack_942 |
                            (ushort)(sStack_932 >= sStack_942) * sStack_932,(undefined6)vHM[1]);
          vH[0]._0_4_ = CONCAT22((ushort)(sStack_92e < sStack_93e) * sStack_93e |
                                 (ushort)(sStack_92e >= sStack_93e) * sStack_92e,
                                 (ushort)(sStack_930 < sStack_940) * sStack_940 |
                                 (ushort)(sStack_930 >= sStack_940) * sStack_930);
          vH[0]._0_6_ = CONCAT24((ushort)(sStack_92c < sStack_93c) * sStack_93c |
                                 (ushort)(sStack_92c >= sStack_93c) * sStack_92c,(undefined4)vH[0]);
          vH[0] = CONCAT26((ushort)(sStack_92a < sStack_93a) * sStack_93a |
                           (ushort)(sStack_92a >= sStack_93a) * sStack_92a,(undefined6)vH[0]);
          auVar53._8_8_ = vHtM[0];
          auVar53._0_8_ = lVar85;
          auVar52._8_8_ = vFM[0];
          auVar52._0_8_ = lVar88;
          auVar51._8_8_ = case1[0];
          auVar51._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar53,auVar52,auVar51);
          auVar50._8_8_ = vHtS[0];
          auVar50._0_8_ = lVar86;
          auVar49._8_8_ = vFS[0];
          auVar49._0_8_ = lVar89;
          auVar48._8_8_ = case1[0];
          auVar48._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar50,auVar49,auVar48);
          auVar47._8_8_ = vHtL[0];
          auVar47._0_8_ = lVar87;
          auVar46._8_8_ = vFL[0];
          auVar46._0_8_ = lVar90;
          auVar45._8_8_ = case1[0];
          auVar45._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar47,auVar46,auVar45);
          for (k = 0; k < iVar79; k = k + 1) {
            lVar17 = ptr[k][0];
            lVar18 = ptr[k][1];
            lVar19 = b[k][0];
            lVar20 = b[k][1];
            auVar30._8_8_ = vH[0];
            auVar30._0_8_ = vHM[1];
            auVar29._8_8_ = uVar12;
            auVar29._0_8_ = uVar9;
            auVar92 = psubsw(auVar30,auVar29);
            auVar28._8_8_ = uVar13;
            auVar28._0_8_ = uVar10;
            auVar93 = psubsw(stack0xffffffffffffeb88,auVar28);
            local_798 = auVar92._0_2_;
            sStack_796 = auVar92._2_2_;
            sStack_794 = auVar92._4_2_;
            sStack_792 = auVar92._6_2_;
            sStack_790 = auVar92._8_2_;
            sStack_78e = auVar92._10_2_;
            sStack_78c = auVar92._12_2_;
            sStack_78a = auVar92._14_2_;
            local_7a8 = auVar93._0_2_;
            sStack_7a6 = auVar93._2_2_;
            sStack_7a4 = auVar93._4_2_;
            sStack_7a2 = auVar93._6_2_;
            sStack_7a0 = auVar93._8_2_;
            sStack_79e = auVar93._10_2_;
            sStack_79c = auVar93._12_2_;
            sStack_79a = auVar93._14_2_;
            uVar84 = (ushort)(local_798 < local_7a8) * local_7a8 |
                     (ushort)(local_798 >= local_7a8) * local_798;
            uVar99 = (ushort)(sStack_796 < sStack_7a6) * sStack_7a6 |
                     (ushort)(sStack_796 >= sStack_7a6) * sStack_796;
            uVar103 = (ushort)(sStack_794 < sStack_7a4) * sStack_7a4 |
                      (ushort)(sStack_794 >= sStack_7a4) * sStack_794;
            uVar111 = (ushort)(sStack_792 < sStack_7a2) * sStack_7a2 |
                      (ushort)(sStack_792 >= sStack_7a2) * sStack_792;
            vF[0]._0_2_ = (ushort)(sStack_790 < sStack_7a0) * sStack_7a0 |
                          (ushort)(sStack_790 >= sStack_7a0) * sStack_790;
            vF[0]._2_2_ = (ushort)(sStack_78e < sStack_79e) * sStack_79e |
                          (ushort)(sStack_78e >= sStack_79e) * sStack_78e;
            vF[0]._4_2_ = (ushort)(sStack_78c < sStack_79c) * sStack_79c |
                          (ushort)(sStack_78c >= sStack_79c) * sStack_78c;
            vF[0]._6_2_ = (ushort)(sStack_78a < sStack_79a) * sStack_79a |
                          (ushort)(sStack_78a >= sStack_79a) * sStack_78a;
            vF_ext[1]._0_4_ = CONCAT22(uVar99,uVar84);
            vF_ext[1]._0_6_ = CONCAT24(uVar103,(undefined4)vF_ext[1]);
            vF_ext[1] = CONCAT26(uVar111,(undefined6)vF_ext[1]);
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_7a6 < sStack_796),-(ushort)(local_7a8 < local_798));
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_7a4 < sStack_794),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_7a2 < sStack_792),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_79e < sStack_78e),-(ushort)(sStack_7a0 < sStack_790));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_79c < sStack_78c),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_79a < sStack_78a),(undefined6)case1[0]);
            auVar44._8_8_ = case1[0];
            auVar44._0_8_ = case2[1];
            register0x00001240 = pblendvb(stack0xffffffffffffeb58,stack0xffffffffffffeb18,auVar44);
            auVar43._8_8_ = case1[0];
            auVar43._0_8_ = case2[1];
            register0x00001240 = pblendvb(stack0xffffffffffffeb48,stack0xffffffffffffeb08,auVar43);
            auVar42._8_8_ = case1[0];
            auVar42._0_8_ = case2[1];
            auVar92 = pblendvb(stack0xffffffffffffeb38,stack0xffffffffffffeaf8,auVar42);
            auVar21._8_8_ = 0x1000100010001;
            auVar21._0_8_ = 0x1000100010001;
            register0x00001200 = paddsw(auVar92,auVar21);
            local_7b8 = (ushort)lVar17;
            uStack_7b6 = (ushort)((ulong)lVar17 >> 0x10);
            uStack_7b4 = (ushort)((ulong)lVar17 >> 0x20);
            uStack_7b2 = (ushort)((ulong)lVar17 >> 0x30);
            uStack_7b0 = (ushort)lVar18;
            uStack_7ae = (ushort)((ulong)lVar18 >> 0x10);
            uStack_7ac = (ushort)((ulong)lVar18 >> 0x20);
            uStack_7aa = (ushort)((ulong)lVar18 >> 0x30);
            local_7c8 = (short)lVar19;
            sStack_7c6 = (short)((ulong)lVar19 >> 0x10);
            sStack_7c4 = (short)((ulong)lVar19 >> 0x20);
            sStack_7c2 = (short)((ulong)lVar19 >> 0x30);
            sStack_7c0 = (short)lVar20;
            sStack_7be = (short)((ulong)lVar20 >> 0x10);
            sStack_7bc = (short)((ulong)lVar20 >> 0x20);
            sStack_7ba = (short)((ulong)lVar20 >> 0x30);
            uVar97 = (ushort)((short)local_7b8 < local_7c8) * local_7c8 |
                     ((short)local_7b8 >= local_7c8) * local_7b8;
            uVar101 = (ushort)((short)uStack_7b6 < sStack_7c6) * sStack_7c6 |
                      ((short)uStack_7b6 >= sStack_7c6) * uStack_7b6;
            uVar108 = (ushort)((short)uStack_7b4 < sStack_7c4) * sStack_7c4 |
                      ((short)uStack_7b4 >= sStack_7c4) * uStack_7b4;
            uVar114 = (ushort)((short)uStack_7b2 < sStack_7c2) * sStack_7c2 |
                      ((short)uStack_7b2 >= sStack_7c2) * uStack_7b2;
            uVar104 = (ushort)((short)uStack_7b0 < sStack_7c0) * sStack_7c0 |
                      ((short)uStack_7b0 >= sStack_7c0) * uStack_7b0;
            uVar109 = (ushort)((short)uStack_7ae < sStack_7be) * sStack_7be |
                      ((short)uStack_7ae >= sStack_7be) * uStack_7ae;
            uVar112 = (ushort)((short)uStack_7ac < sStack_7bc) * sStack_7bc |
                      ((short)uStack_7ac >= sStack_7bc) * uStack_7ac;
            uVar115 = (ushort)((short)uStack_7aa < sStack_7ba) * sStack_7ba |
                      ((short)uStack_7aa >= sStack_7ba) * uStack_7aa;
            uVar97 = ((short)uVar97 < (short)uVar84) * uVar84 |
                     ((short)uVar97 >= (short)uVar84) * uVar97;
            uVar101 = ((short)uVar101 < (short)uVar99) * uVar99 |
                      ((short)uVar101 >= (short)uVar99) * uVar101;
            uVar108 = ((short)uVar108 < (short)uVar103) * uVar103 |
                      ((short)uVar108 >= (short)uVar103) * uVar108;
            uVar114 = ((short)uVar114 < (short)uVar111) * uVar111 |
                      ((short)uVar114 >= (short)uVar111) * uVar114;
            uVar104 = ((short)uVar104 < (short)(ushort)vF[0]) * (ushort)vF[0] |
                      ((short)uVar104 >= (short)(ushort)vF[0]) * uVar104;
            uVar109 = ((short)uVar109 < (short)vF[0]._2_2_) * vF[0]._2_2_ |
                      ((short)uVar109 >= (short)vF[0]._2_2_) * uVar109;
            uVar112 = ((short)uVar112 < (short)vF[0]._4_2_) * vF[0]._4_2_ |
                      ((short)uVar112 >= (short)vF[0]._4_2_) * uVar112;
            uVar115 = ((short)uVar115 < (short)vF[0]._6_2_) * vF[0]._6_2_ |
                      ((short)uVar115 >= (short)vF[0]._6_2_) * uVar115;
            vHM[1]._0_4_ = CONCAT22(uVar101,uVar97);
            vHM[1]._0_6_ = CONCAT24(uVar108,(undefined4)vHM[1]);
            vHM[1] = CONCAT26(uVar114,(undefined6)vHM[1]);
            vH[0]._0_4_ = CONCAT22(uVar109,uVar104);
            vH[0]._0_6_ = CONCAT24(uVar112,(undefined4)vH[0]);
            vH[0] = CONCAT26(uVar115,(undefined6)vH[0]);
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(uVar101 == uStack_7b6),-(ushort)(uVar97 == local_7b8));
            case2[1]._0_6_ = CONCAT24(-(ushort)(uVar108 == uStack_7b4),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(uVar114 == uStack_7b2),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(uVar109 == uStack_7ae),-(ushort)(uVar104 == uStack_7b0));
            case1[0]._0_6_ = CONCAT24(-(ushort)(uVar112 == uStack_7ac),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(uVar115 == uStack_7aa),(undefined6)case1[0]);
            sVar78 = -(ushort)(uVar97 == uVar84);
            sVar98 = -(ushort)(uVar101 == uVar99);
            sVar100 = -(ushort)(uVar108 == uVar103);
            sVar102 = -(ushort)(uVar114 == uVar111);
            sVar105 = -(ushort)(uVar104 == (ushort)vF[0]);
            sVar110 = -(ushort)(uVar109 == vF[0]._2_2_);
            sVar113 = -(ushort)(uVar112 == vF[0]._4_2_);
            sVar116 = -(ushort)(uVar115 == vF[0]._6_2_);
            auVar41._2_2_ = sVar98;
            auVar41._0_2_ = sVar78;
            auVar41._4_2_ = sVar100;
            auVar41._6_2_ = sVar102;
            auVar41._10_2_ = sVar110;
            auVar41._8_2_ = sVar105;
            auVar41._12_2_ = sVar113;
            auVar41._14_2_ = sVar116;
            auVar92 = pblendvb((undefined1  [16])b_00[k],register0x00001240,auVar41);
            auVar40._8_8_ = case1[0];
            auVar40._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar92,(undefined1  [16])b_03[k],auVar40);
            auVar39._2_2_ = sVar98;
            auVar39._0_2_ = sVar78;
            auVar39._4_2_ = sVar100;
            auVar39._6_2_ = sVar102;
            auVar39._10_2_ = sVar110;
            auVar39._8_2_ = sVar105;
            auVar39._12_2_ = sVar113;
            auVar39._14_2_ = sVar116;
            auVar92 = pblendvb((undefined1  [16])b_01[k],register0x00001240,auVar39);
            auVar38._8_8_ = case1[0];
            auVar38._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar92,(undefined1  [16])b_04[k],auVar38);
            auVar37._2_2_ = sVar98;
            auVar37._0_2_ = sVar78;
            auVar37._4_2_ = sVar100;
            auVar37._6_2_ = sVar102;
            auVar37._10_2_ = sVar110;
            auVar37._8_2_ = sVar105;
            auVar37._12_2_ = sVar113;
            auVar37._14_2_ = sVar116;
            auVar92 = pblendvb((undefined1  [16])b_02[k],register0x00001200,auVar37);
            auVar36._8_8_ = case1[0];
            auVar36._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar92,(undefined1  [16])b_05[k],auVar36);
            ptr[k][0] = vHM[1];
            ptr[k][1] = vH[0];
            b_03[k][0] = vHS[1];
            b_03[k][1] = vHM[0];
            b_04[k][0] = vHL[1];
            b_04[k][1] = vHS[0];
            b_05[k][0] = vHp[1];
            b_05[k][1] = vHL[0];
            local_98 = (short)vSaturationCheckMax[1];
            sStack_96 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_94 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_92 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_90 = (short)vSaturationCheckMin[0];
            sStack_8e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_8c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_8a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            vSaturationCheckMax[1] =
                 CONCAT26(((short)uVar114 < sStack_92) * uVar114 |
                          (ushort)((short)uVar114 >= sStack_92) * sStack_92,
                          CONCAT24(((short)uVar108 < sStack_94) * uVar108 |
                                   (ushort)((short)uVar108 >= sStack_94) * sStack_94,
                                   CONCAT22(((short)uVar101 < sStack_96) * uVar101 |
                                            (ushort)((short)uVar101 >= sStack_96) * sStack_96,
                                            ((short)uVar97 < local_98) * uVar97 |
                                            (ushort)((short)uVar97 >= local_98) * local_98)));
            vSaturationCheckMin[0] =
                 CONCAT26(((short)uVar115 < sStack_8a) * uVar115 |
                          (ushort)((short)uVar115 >= sStack_8a) * sStack_8a,
                          CONCAT24(((short)uVar112 < sStack_8c) * uVar112 |
                                   (ushort)((short)uVar112 >= sStack_8c) * sStack_8c,
                                   CONCAT22(((short)uVar109 < sStack_8e) * uVar109 |
                                            (ushort)((short)uVar109 >= sStack_8e) * sStack_8e,
                                            ((short)uVar104 < sStack_90) * uVar104 |
                                            (ushort)((short)uVar104 >= sStack_90) * sStack_90)));
            local_7f8 = (short)vMaxH[1];
            sStack_7f6 = (short)((ulong)vMaxH[1] >> 0x10);
            sStack_7f4 = (short)((ulong)vMaxH[1] >> 0x20);
            sStack_7f2 = (short)((ulong)vMaxH[1] >> 0x30);
            sStack_7f0 = (short)vSaturationCheckMax[0];
            sStack_7ee = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_7ec = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_7ea = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            uVar84 = (local_7f8 < (short)uVar97) * uVar97 |
                     (ushort)(local_7f8 >= (short)uVar97) * local_7f8;
            uVar97 = (sStack_7f6 < (short)uVar101) * uVar101 |
                     (ushort)(sStack_7f6 >= (short)uVar101) * sStack_7f6;
            uVar99 = (sStack_7f4 < (short)uVar108) * uVar108 |
                     (ushort)(sStack_7f4 >= (short)uVar108) * sStack_7f4;
            uVar101 = (sStack_7f2 < (short)uVar114) * uVar114 |
                      (ushort)(sStack_7f2 >= (short)uVar114) * sStack_7f2;
            uVar103 = (sStack_7f0 < (short)uVar104) * uVar104 |
                      (ushort)(sStack_7f0 >= (short)uVar104) * sStack_7f0;
            uVar108 = (sStack_7ee < (short)uVar109) * uVar109 |
                      (ushort)(sStack_7ee >= (short)uVar109) * sStack_7ee;
            uVar111 = (sStack_7ec < (short)uVar112) * uVar112 |
                      (ushort)(sStack_7ec >= (short)uVar112) * sStack_7ec;
            uVar114 = (sStack_7ea < (short)uVar115) * uVar115 |
                      (ushort)(sStack_7ea >= (short)uVar115) * sStack_7ea;
            local_828 = (short)vHS[1];
            sStack_826 = vHS[1]._2_2_;
            sStack_824 = vHS[1]._4_2_;
            sStack_822 = vHS[1]._6_2_;
            sStack_820 = (short)vHS[2];
            sStack_81e = vHS[2]._2_2_;
            sStack_81c = vHS[2]._4_2_;
            sStack_81a = vHS[2]._6_2_;
            uVar84 = (ushort)((short)uVar84 < local_828) * local_828 |
                     ((short)uVar84 >= local_828) * uVar84;
            uVar97 = (ushort)((short)uVar97 < sStack_826) * sStack_826 |
                     ((short)uVar97 >= sStack_826) * uVar97;
            uVar99 = (ushort)((short)uVar99 < sStack_824) * sStack_824 |
                     ((short)uVar99 >= sStack_824) * uVar99;
            uVar101 = (ushort)((short)uVar101 < sStack_822) * sStack_822 |
                      ((short)uVar101 >= sStack_822) * uVar101;
            uVar103 = (ushort)((short)uVar103 < sStack_820) * sStack_820 |
                      ((short)uVar103 >= sStack_820) * uVar103;
            uVar108 = (ushort)((short)uVar108 < sStack_81e) * sStack_81e |
                      ((short)uVar108 >= sStack_81e) * uVar108;
            uVar111 = (ushort)((short)uVar111 < sStack_81c) * sStack_81c |
                      ((short)uVar111 >= sStack_81c) * uVar111;
            uVar114 = (ushort)((short)uVar114 < sStack_81a) * sStack_81a |
                      ((short)uVar114 >= sStack_81a) * uVar114;
            local_848 = (short)vHL[1];
            sStack_846 = vHL[1]._2_2_;
            sStack_844 = vHL[1]._4_2_;
            sStack_842 = vHL[1]._6_2_;
            sStack_840 = (short)vHL[2];
            sStack_83e = vHL[2]._2_2_;
            sStack_83c = vHL[2]._4_2_;
            sStack_83a = vHL[2]._6_2_;
            uVar84 = (ushort)((short)uVar84 < local_848) * local_848 |
                     ((short)uVar84 >= local_848) * uVar84;
            uVar97 = (ushort)((short)uVar97 < sStack_846) * sStack_846 |
                     ((short)uVar97 >= sStack_846) * uVar97;
            uVar99 = (ushort)((short)uVar99 < sStack_844) * sStack_844 |
                     ((short)uVar99 >= sStack_844) * uVar99;
            uVar101 = (ushort)((short)uVar101 < sStack_842) * sStack_842 |
                      ((short)uVar101 >= sStack_842) * uVar101;
            uVar103 = (ushort)((short)uVar103 < sStack_840) * sStack_840 |
                      ((short)uVar103 >= sStack_840) * uVar103;
            uVar108 = (ushort)((short)uVar108 < sStack_83e) * sStack_83e |
                      ((short)uVar108 >= sStack_83e) * uVar108;
            uVar111 = (ushort)((short)uVar111 < sStack_83c) * sStack_83c |
                      ((short)uVar111 >= sStack_83c) * uVar111;
            uVar114 = (ushort)((short)uVar114 < sStack_83a) * sStack_83a |
                      ((short)uVar114 >= sStack_83a) * uVar114;
            local_868 = (short)vHp[1];
            sStack_866 = vHp[1]._2_2_;
            sStack_864 = vHp[1]._4_2_;
            sStack_862 = vHp[1]._6_2_;
            sStack_860 = (short)vHp[2];
            sStack_85e = vHp[2]._2_2_;
            sStack_85c = vHp[2]._4_2_;
            sStack_85a = vHp[2]._6_2_;
            vMaxH[1] = CONCAT26((ushort)((short)uVar101 < sStack_862) * sStack_862 |
                                ((short)uVar101 >= sStack_862) * uVar101,
                                CONCAT24((ushort)((short)uVar99 < sStack_864) * sStack_864 |
                                         ((short)uVar99 >= sStack_864) * uVar99,
                                         CONCAT22((ushort)((short)uVar97 < sStack_866) * sStack_866
                                                  | ((short)uVar97 >= sStack_866) * uVar97,
                                                  (ushort)((short)uVar84 < local_868) * local_868 |
                                                  ((short)uVar84 >= local_868) * uVar84)));
            vSaturationCheckMax[0] =
                 CONCAT26((ushort)((short)uVar114 < sStack_85a) * sStack_85a |
                          ((short)uVar114 >= sStack_85a) * uVar114,
                          CONCAT24((ushort)((short)uVar111 < sStack_85c) * sStack_85c |
                                   ((short)uVar111 >= sStack_85c) * uVar111,
                                   CONCAT22((ushort)((short)uVar108 < sStack_85e) * sStack_85e |
                                            ((short)uVar108 >= sStack_85e) * uVar108,
                                            (ushort)((short)uVar103 < sStack_860) * sStack_860 |
                                            ((short)uVar103 >= sStack_860) * uVar103)));
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar79;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                             &profile_local->matrix)->trace->trace_del_table,vH_00,s1Len,s2Len,
                            iVar81,in_stack_ffffffffffffe918);
            vH_01[0] = (ulong)(uint)k;
            vH_01[1]._0_4_ = iVar79;
            vH_01[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 8),
                            vH_01,s1Len,s2Len,iVar81,in_stack_ffffffffffffe918);
            vH_02[0] = (ulong)(uint)k;
            vH_02[1]._0_4_ = iVar79;
            vH_02[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 0x10),
                            vH_02,s1Len,s2Len,iVar81,in_stack_ffffffffffffe918);
            vH_03[0] = (ulong)(uint)k;
            vH_03[1]._0_4_ = iVar79;
            vH_03[1]._4_4_ = 0;
            arr_store_si128(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                            &profile_local->matrix)->trace->trace_del_table + 0x18),
                            vH_03,s1Len,s2Len,iVar81,in_stack_ffffffffffffe918);
          }
          lVar17 = ptr[iVar83][0];
          lVar18 = ptr[iVar83][1];
          local_978 = (short)lVar17;
          sStack_976 = (short)((ulong)lVar17 >> 0x10);
          sStack_974 = (short)((ulong)lVar17 >> 0x20);
          sStack_972 = (short)((ulong)lVar17 >> 0x30);
          sStack_970 = (short)lVar18;
          sStack_96e = (short)((ulong)lVar18 >> 0x10);
          sStack_96c = (short)((ulong)lVar18 >> 0x20);
          sStack_96a = (short)((ulong)lVar18 >> 0x30);
          local_988 = (short)vMaxM[1];
          sStack_986 = (short)((ulong)vMaxM[1] >> 0x10);
          sStack_984 = (short)((ulong)vMaxM[1] >> 0x20);
          sStack_982 = (short)((ulong)vMaxM[1] >> 0x30);
          sStack_980 = (short)vMaxH[0];
          sStack_97e = (short)((ulong)vMaxH[0] >> 0x10);
          sStack_97c = (short)((ulong)vMaxH[0] >> 0x20);
          sStack_97a = (short)((ulong)vMaxH[0] >> 0x30);
          sVar78 = -(ushort)(local_988 < local_978);
          sVar98 = -(ushort)(sStack_986 < sStack_976);
          sVar100 = -(ushort)(sStack_984 < sStack_974);
          sVar102 = -(ushort)(sStack_982 < sStack_972);
          sVar105 = -(ushort)(sStack_980 < sStack_970);
          sVar110 = -(ushort)(sStack_97e < sStack_96e);
          sVar113 = -(ushort)(sStack_97c < sStack_96c);
          sVar116 = -(ushort)(sStack_97a < sStack_96a);
          vMaxM[1] = CONCAT26((ushort)(sStack_982 < sStack_972) * sStack_972 |
                              (ushort)(sStack_982 >= sStack_972) * sStack_982,
                              CONCAT24((ushort)(sStack_984 < sStack_974) * sStack_974 |
                                       (ushort)(sStack_984 >= sStack_974) * sStack_984,
                                       CONCAT22((ushort)(sStack_986 < sStack_976) * sStack_976 |
                                                (ushort)(sStack_986 >= sStack_976) * sStack_986,
                                                (ushort)(local_988 < local_978) * local_978 |
                                                (ushort)(local_988 >= local_978) * local_988)));
          vMaxH[0] = CONCAT26((ushort)(sStack_97a < sStack_96a) * sStack_96a |
                              (ushort)(sStack_97a >= sStack_96a) * sStack_97a,
                              CONCAT24((ushort)(sStack_97c < sStack_96c) * sStack_96c |
                                       (ushort)(sStack_97c >= sStack_96c) * sStack_97c,
                                       CONCAT22((ushort)(sStack_97e < sStack_96e) * sStack_96e |
                                                (ushort)(sStack_97e >= sStack_96e) * sStack_97e,
                                                (ushort)(sStack_980 < sStack_970) * sStack_970 |
                                                (ushort)(sStack_980 >= sStack_970) * sStack_980)));
          auVar35._2_2_ = sVar98;
          auVar35._0_2_ = sVar78;
          auVar35._4_2_ = sVar100;
          auVar35._6_2_ = sVar102;
          auVar35._10_2_ = sVar110;
          auVar35._8_2_ = sVar105;
          auVar35._12_2_ = sVar113;
          auVar35._14_2_ = sVar116;
          register0x00001240 =
               pblendvb(stack0xffffffffffffecf8,(undefined1  [16])b_03[iVar83],auVar35);
          auVar34._2_2_ = sVar98;
          auVar34._0_2_ = sVar78;
          auVar34._4_2_ = sVar100;
          auVar34._6_2_ = sVar102;
          auVar34._10_2_ = sVar110;
          auVar34._8_2_ = sVar105;
          auVar34._12_2_ = sVar113;
          auVar34._14_2_ = sVar116;
          register0x00001240 =
               pblendvb(stack0xffffffffffffece8,(undefined1  [16])b_04[iVar83],auVar34);
          auVar33._2_2_ = sVar98;
          auVar33._0_2_ = sVar78;
          auVar33._4_2_ = sVar100;
          auVar33._6_2_ = sVar102;
          auVar33._10_2_ = sVar110;
          auVar33._8_2_ = sVar105;
          auVar33._12_2_ = sVar113;
          auVar33._14_2_ = sVar116;
          register0x00001240 =
               pblendvb(stack0xffffffffffffecd8,(undefined1  [16])b_05[iVar83],auVar33);
          uVar107 = CONCAT26(-(ushort)((short)pvP == 0),
                             CONCAT24(-(ushort)((short)pvP == 1),
                                      CONCAT22(-(ushort)((short)pvP == 2),-(ushort)((short)pvP == 3)
                                              ))) &
                    CONCAT26(sVar116,CONCAT24(sVar113,CONCAT22(sVar110,sVar105)));
          auVar74._8_8_ = uVar107;
          auVar74._0_8_ =
               CONCAT26(-(ushort)((short)pvP == 4),
                        CONCAT24(-(ushort)((short)pvP == 5),
                                 CONCAT22(-(ushort)((short)pvP == 6),-(ushort)((short)pvP == 7)))) &
               CONCAT26(sVar102,CONCAT24(sVar100,CONCAT22(sVar98,sVar78)));
          if ((((((((((((((((auVar74 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar74 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar74 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar74 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar74 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar74 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar74 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar107 >> 7 & 1) != 0) || (uVar107 >> 0xf & 1) != 0) ||
                  (uVar107 >> 0x17 & 1) != 0) || (uVar107 >> 0x1f & 1) != 0) ||
                (uVar107 >> 0x27 & 1) != 0) || (uVar107 >> 0x2f & 1) != 0) ||
              (uVar107 >> 0x37 & 1) != 0) || (long)uVar107 < 0) {
            matrix._0_4_ = s1Len;
          }
        }
        local_129a = uVar76;
        if (s2_end != 0) {
          for (end_query = 0; end_query < iVar80; end_query = end_query + 1) {
            vMaxH[0] = vMaxH[0] << 0x10 | (ulong)vMaxM[1] >> 0x30;
            vMaxM[0] = vMaxM[0] << 0x10 | (ulong)vMaxS[1] >> 0x30;
            vMaxS[1] = vMaxS[1] << 0x10;
            vMaxS[0] = vMaxS[0] << 0x10 | (ulong)vMaxL[1] >> 0x30;
            vMaxL[1] = vMaxL[1] << 0x10;
            vMaxL[0] = vMaxL[0] << 0x10 | (ulong)vPosMask[1] >> 0x30;
            vPosMask[1] = vPosMask[1] << 0x10;
            vMaxM[1] = vMaxM[1] << 0x10;
          }
          local_129a = vMaxH[0]._6_2_;
          local_129c = vMaxM[0]._6_2_;
          local_129e = vMaxS[0]._6_2_;
          local_12a0 = vMaxL[0]._6_2_;
        }
        matrix._4_4_ = iVar1 + -1;
        if (s1_end != 0) {
          _temp = b_05;
          l = (int16_t *)b_04;
          s = (int16_t *)b_03;
          m = (int16_t *)ptr;
          for (k = 0; k < iVar79 * 8; k = k + 1) {
            iVar81 = k / 8 + (k % 8) * iVar79;
            if (iVar81 < iVar1) {
              if ((short)local_129a < *m) {
                local_129a = *m;
                matrix._0_4_ = s2Len + -1;
                local_129c = *s;
                local_129e = *l;
                local_12a0 = (short)(*_temp)[0];
                matrix._4_4_ = iVar81;
              }
              else if (((*m == local_129a) && ((int)matrix == s2Len + -1)) &&
                      (iVar81 < matrix._4_4_)) {
                local_129c = *s;
                local_129e = *l;
                local_12a0 = (short)(*_temp)[0];
                matrix._4_4_ = iVar81;
              }
            }
            m = m + 1;
            s = s + 1;
            l = l + 1;
            _temp = (__m128i *)((long)*_temp + 2);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          vH_1[0] = ptr[iVar83][1];
          vHM_1[0] = b_03[iVar83][1];
          vHS_1[0] = b_04[iVar83][1];
          vHL_1[0] = b_05[iVar83][1];
          uStack_16a8 = b_05[iVar83][0];
          vHL_1[1] = b_04[iVar83][0];
          vHS_1[1] = b_03[iVar83][0];
          vHM_1[1] = ptr[iVar83][0];
          for (end_query = 0; end_query < iVar80; end_query = end_query + 1) {
            vH_1[0] = vH_1[0] << 0x10 | (ulong)vHM_1[1] >> 0x30;
            vHM_1[0] = vHM_1[0] << 0x10 | (ulong)vHS_1[1] >> 0x30;
            vHS_1[0] = vHS_1[0] << 0x10 | (ulong)vHL_1[1] >> 0x30;
            vHL_1[0] = vHL_1[0] << 0x10 | uStack_16a8 >> 0x30;
            uStack_16a8 = uStack_16a8 << 0x10;
            vHL_1[1] = vHL_1[1] << 0x10;
            vHS_1[1] = vHS_1[1] << 0x10;
            vHM_1[1] = vHM_1[1] << 0x10;
          }
          matrix._0_4_ = s2Len + -1;
          matrix._4_4_ = iVar1 + -1;
          local_129a = vH_1[0]._6_2_;
          local_129c = vHM_1[0]._6_2_;
          local_129e = vHS_1[0]._6_2_;
          local_12a0 = vHL_1[0]._6_2_;
        }
        local_28 = (short)vSaturationCheckMax[1];
        sStack_26 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_24 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_22 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_20 = (short)vSaturationCheckMin[0];
        sStack_1e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_1c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_1a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_998 = (short)vMaxH[1];
        sStack_996 = (short)((ulong)vMaxH[1] >> 0x10);
        sStack_994 = (short)((ulong)vMaxH[1] >> 0x20);
        sStack_992 = (short)((ulong)vMaxH[1] >> 0x30);
        sStack_990 = (short)vSaturationCheckMax[0];
        sStack_98e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_98c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_98a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar107 = CONCAT26(-(ushort)(sStack_1a < (short)uVar76),
                           CONCAT24(-(ushort)(sStack_1c < (short)uVar76),
                                    CONCAT22(-(ushort)(sStack_1e < (short)uVar76),
                                             -(ushort)(sStack_20 < (short)uVar76)))) |
                  CONCAT26(-(ushort)(sVar77 < sStack_98a),
                           CONCAT24(-(ushort)(sVar77 < sStack_98c),
                                    CONCAT22(-(ushort)(sVar77 < sStack_98e),
                                             -(ushort)(sVar77 < sStack_990))));
        auVar73._8_8_ = uVar107;
        auVar73._0_8_ =
             CONCAT26(-(ushort)(sStack_22 < (short)uVar76),
                      CONCAT24(-(ushort)(sStack_24 < (short)uVar76),
                               CONCAT22(-(ushort)(sStack_26 < (short)uVar76),
                                        -(ushort)(local_28 < (short)uVar76)))) |
             CONCAT26(-(ushort)(sVar77 < sStack_992),
                      CONCAT24(-(ushort)(sVar77 < sStack_994),
                               CONCAT22(-(ushort)(sVar77 < sStack_996),-(ushort)(sVar77 < local_998)
                                       )));
        if ((((((((((((((((auVar73 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar73 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar73 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar73 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar73 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar73 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar107 >> 7 & 1) != 0) || (uVar107 >> 0xf & 1) != 0) ||
                (uVar107 >> 0x17 & 1) != 0) || (uVar107 >> 0x1f & 1) != 0) ||
              (uVar107 >> 0x27 & 1) != 0) || (uVar107 >> 0x2f & 1) != 0) ||
            (uVar107 >> 0x37 & 1) != 0) || (long)uVar107 < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          local_129a = 0;
          local_129c = 0;
          local_129e = 0;
          local_12a0 = 0;
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int *)&profile_local->s1 = (int)(short)local_129a;
        *(int *)((long)&profile_local->s1 + 4) = matrix._4_4_;
        profile_local->s1Len = (int)matrix;
        *(int *)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->extra =
             (int)local_129c;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->similar =
             (int)local_129e;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->length =
             (int)local_12a0;
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(b_05);
        parasail_free(b_04);
        parasail_free(b_03);
        parasail_free(ptr);
        parasail_free(b_02);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            cond_max = _mm_cmpgt_epi16(vH, vMaxH);
            vMaxH = _mm_max_epi16(vMaxH, vH);
            vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
            vMaxM = _mm_slli_si128(vMaxM, 2);
            vMaxS = _mm_slli_si128(vMaxS, 2);
            vMaxL = _mm_slli_si128(vMaxL, 2);
        }
        end_query = s1Len-1;
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        matches = (int16_t) _mm_extract_epi16(vMaxM, 7);
        similar = (int16_t) _mm_extract_epi16(vMaxS, 7);
        length = (int16_t) _mm_extract_epi16(vMaxL, 7);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int16_t *m = (int16_t*)pvHM;
        int16_t *s = (int16_t*)pvHS;
        int16_t *l = (int16_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}